

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O2

void __thiscall
absl::cord_internal::CordzInfo::CordzInfo
          (CordzInfo *this,CordRep *rep,CordzInfo *src,MethodIdentifier method,
          int64_t sampling_stride)

{
  Counter *pCVar1;
  int iVar2;
  MethodIdentifier MVar3;
  size_t sVar4;
  Duration DVar5;
  
  CordzHandle::CordzHandle(&this->super_CordzHandle);
  (this->super_CordzHandle)._vptr_CordzHandle = (_func_int **)&PTR__CordzInfo_0018fe60;
  this->list_ = (List *)global_list_;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  (this->ci_prev_)._M_b._M_p = (__pointer_type)0x0;
  (this->ci_next_)._M_b._M_p = (__pointer_type)0x0;
  this->rep_ = rep;
  iVar2 = GetStackTrace(this->stack_,0x40,1);
  this->stack_depth_ = (long)iVar2;
  sVar4 = FillParentStack(src,this->parent_stack_);
  this->parent_stack_depth_ = sVar4;
  this->method_ = method;
  if (src == (CordzInfo *)0x0) {
    MVar3 = kUnknown;
  }
  else {
    MVar3 = src->parent_method_;
    if (MVar3 == kUnknown) {
      MVar3 = src->method_;
    }
  }
  this->parent_method_ = MVar3;
  memset(&this->update_tracker_,0,200);
  DVar5 = (Duration)Now();
  (this->create_time_).rep_ = DVar5;
  this->sampling_stride_ = sampling_stride;
  pCVar1 = (this->update_tracker_).values_ + method;
  (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i =
       (pCVar1->super_atomic<long>).super___atomic_base<long>._M_i + 1;
  if (src != (CordzInfo *)0x0) {
    CordzUpdateTracker::LossyAdd(&this->update_tracker_,&src->update_tracker_);
    return;
  }
  return;
}

Assistant:

CordzInfo::CordzInfo(CordRep* rep, const CordzInfo* src,
                     MethodIdentifier method, int64_t sampling_stride)
    : rep_(rep),
      stack_depth_(
          static_cast<size_t>(absl::GetStackTrace(stack_,
                                                  /*max_depth=*/kMaxStackDepth,
                                                  /*skip_count=*/1))),
      parent_stack_depth_(FillParentStack(src, parent_stack_)),
      method_(method),
      parent_method_(GetParentMethod(src)),
      create_time_(absl::Now()),
      sampling_stride_(sampling_stride) {
  update_tracker_.LossyAdd(method);
  if (src) {
    // Copy parent counters.
    update_tracker_.LossyAdd(src->update_tracker_);
  }
}